

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

void __thiscall flatbuffers::Parser::Next(Parser *this)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  byte *extraout_RAX;
  byte *__first;
  byte *pbVar4;
  char cVar5;
  uint uVar6;
  string *psVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string ch;
  
  (this->doc_comment_)._M_string_length = 0;
  __lhs = &this->doc_comment_;
  *(this->doc_comment_)._M_dataplus._M_p = '\0';
  bVar2 = false;
LAB_0010f5d3:
  do {
    pbVar4 = (byte *)this->cursor_;
switchD_0010f613_caseD_20:
    do {
      __first = pbVar4;
      pbVar4 = __first + 1;
      this->cursor_ = (char *)pbVar4;
      bVar1 = *__first;
      uVar6 = (uint)bVar1;
      this->token_ = (int)(char)bVar1;
      switch(uVar6) {
      case 0x20:
        goto switchD_0010f613_caseD_20;
      case 0x21:
      case 0x23:
      case 0x24:
      case 0x25:
      case 0x26:
      case 0x27:
      case 0x2a:
      case 0x2b:
      case 0x2d:
        goto switchD_0010f613_caseD_21;
      case 0x22:
        std::__cxx11::string::assign((char *)&this->attribute_);
        goto LAB_0010f787;
      case 0x28:
      case 0x29:
      case 0x2c:
        return;
      case 0x2e:
        if (9 < (int)(char)*pbVar4 - 0x30U) {
          return;
        }
        std::__cxx11::string::string
                  ((string *)&ch,"floating point constant can\'t start with \".\"",
                   (allocator *)&stack0xffffffffffffff90);
        Error(&ch);
        pbVar4 = extraout_RAX;
        goto LAB_0010f844;
      case 0x2f:
        if (*pbVar4 != 0x2f) goto switchD_0010f613_caseD_21;
        pbVar4 = __first + 2;
        while( true ) {
          this->cursor_ = (char *)pbVar4;
          if ((*pbVar4 == 0) || (*pbVar4 == 10)) break;
          pbVar4 = pbVar4 + 1;
        }
        if (__first[2] == 0x2f) {
          if (!bVar2) {
            std::__cxx11::string::string
                      ((string *)&ch,"a documentation comment should be on a line on its own",
                       (allocator *)&stack0xffffffffffffff90);
            Error(&ch);
            goto LAB_0010fc14;
          }
          ch._M_dataplus._M_p = (pointer)&ch.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&ch,__first + 3);
          std::__cxx11::string::append((string *)__lhs);
          std::__cxx11::string::~string((string *)&ch);
          bVar2 = true;
          goto LAB_0010f5d3;
        }
        goto switchD_0010f613_caseD_20;
      }
    } while ((uVar6 == 9) || (uVar6 == 0xd));
    if ((uVar6 - 0x3a < 0x24) && ((0xa0000000bU >> ((ulong)(uVar6 - 0x3a) & 0x3f) & 1) != 0)) {
      return;
    }
    if (uVar6 == 0x7d) {
      return;
    }
    if (uVar6 != 10) goto LAB_0010f6b7;
    this->line_ = this->line_ + 1;
    bVar2 = true;
  } while( true );
LAB_0010f787:
  pbVar4 = (byte *)this->cursor_;
  bVar1 = *pbVar4;
  if (bVar1 == 0x22) {
LAB_0010f844:
    this->cursor_ = (char *)(pbVar4 + 1);
    this->token_ = 1;
    return;
  }
  if (bVar1 < 0x20) {
    std::__cxx11::string::string
              ((string *)&ch,"illegal character in string constant",
               (allocator *)&stack0xffffffffffffff90);
    Error(&ch);
    goto LAB_0010fb03;
  }
  this->cursor_ = (char *)(pbVar4 + 1);
  cVar5 = (char)&this->attribute_;
  if (bVar1 == 0x5c) {
    bVar1 = pbVar4[1];
    if ((((bVar1 != 0x22) && (bVar1 != 0x5c)) && (bVar1 != 0x74)) &&
       ((bVar1 != 0x72 && (bVar1 != 0x6e)))) {
      std::__cxx11::string::string
                ((string *)&ch,"unknown escape code in string constant",
                 (allocator *)&stack0xffffffffffffff90);
      Error(&ch);
      goto LAB_0010fbac;
    }
    std::__cxx11::string::push_back(cVar5);
    this->cursor_ = this->cursor_ + 1;
  }
  else {
    std::__cxx11::string::push_back(cVar5);
  }
  goto LAB_0010f787;
LAB_0010f6b7:
  if (uVar6 == 0x7b) {
    return;
  }
  if (bVar1 == 0) {
    this->cursor_ = (char *)__first;
    this->token_ = 0;
    return;
  }
switchD_0010f613_caseD_21:
  iVar3 = isalpha(uVar6);
  if (iVar3 == 0) {
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ch.field_2;
    if (uVar6 == 0x2d || uVar6 - 0x30 < 10) {
      pbVar4 = __first + 2;
      while (pbVar4[-1] - 0x30 < 10) {
        this->cursor_ = (char *)pbVar4;
        pbVar4 = pbVar4 + 1;
      }
      if (pbVar4[-1] == 0x2e) {
        iVar3 = 3;
        do {
          this->cursor_ = (char *)pbVar4;
          bVar1 = *pbVar4;
          pbVar4 = pbVar4 + 1;
        } while (bVar1 - 0x30 < 10);
      }
      else {
        iVar3 = 2;
      }
      this->token_ = iVar3;
      (this->attribute_)._M_string_length = 0;
      *(this->attribute_)._M_dataplus._M_p = '\0';
      std::__cxx11::string::append<char_const*,void>
                ((string *)&this->attribute_,(char *)__first,this->cursor_);
      return;
    }
LAB_0010fc14:
    ch._M_string_length = 0;
    ch.field_2._M_local_buf[0] = '\0';
    this = (Parser *)(ulong)(uint)(int)(char)bVar1;
    ch._M_dataplus._M_p = (pointer)__lhs;
    std::__cxx11::string::operator=((string *)&ch,bVar1);
    if ((byte)(bVar1 + 0x81) < 0xa1) {
      NumToString<char>((string *)&stack0xffffffffffffffb0,bVar1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xffffffffffffff90,"code: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xffffffffffffffb0);
      this = (Parser *)&stack0xffffffffffffff90;
      std::__cxx11::string::operator=((string *)&ch,(string *)this);
      std::__cxx11::string::~string((string *)this);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xffffffffffffff90,"illegal character: ",&ch);
    Error((string *)&stack0xffffffffffffff90);
  }
  else {
    pbVar4 = __first + 2;
    while ((bVar1 = pbVar4[-1], iVar3 = isalnum((uint)bVar1), bVar1 == 0x5f || (iVar3 != 0))) {
      this->cursor_ = (char *)pbVar4;
      pbVar4 = pbVar4 + 1;
    }
    (this->attribute_)._M_string_length = 0;
    psVar7 = &this->attribute_;
    *(this->attribute_)._M_dataplus._M_p = '\0';
    std::__cxx11::string::append<char_const*,void>((string *)psVar7,(char *)__first,this->cursor_);
    bVar2 = std::operator==(psVar7,"");
    if (bVar2) {
      this->token_ = 0xb;
      return;
    }
    bVar2 = std::operator==(psVar7,"");
    if (bVar2) {
      this->token_ = 0xc;
      return;
    }
    bVar2 = std::operator==(psVar7,"bool");
    if (bVar2) {
      this->token_ = 0xd;
      return;
    }
    bVar2 = std::operator==(psVar7,"byte");
    if (bVar2) {
      this->token_ = 0xe;
      return;
    }
    bVar2 = std::operator==(psVar7,"ubyte");
    if (bVar2) {
      this->token_ = 0xf;
      return;
    }
    bVar2 = std::operator==(psVar7,"short");
    if (bVar2) {
      this->token_ = 0x10;
      return;
    }
    bVar2 = std::operator==(psVar7,"ushort");
    if (bVar2) {
      this->token_ = 0x11;
      return;
    }
    bVar2 = std::operator==(psVar7,"int");
    if (bVar2) {
      this->token_ = 0x12;
      return;
    }
    bVar2 = std::operator==(psVar7,"uint");
    if (bVar2) {
      this->token_ = 0x13;
      return;
    }
    bVar2 = std::operator==(psVar7,"long");
    if (bVar2) {
      this->token_ = 0x14;
      return;
    }
    bVar2 = std::operator==(psVar7,"ulong");
    if (bVar2) {
      this->token_ = 0x15;
      return;
    }
    bVar2 = std::operator==(psVar7,"float");
    if (bVar2) {
      this->token_ = 0x16;
      return;
    }
    bVar2 = std::operator==(psVar7,"double");
    if (bVar2) {
      this->token_ = 0x17;
      return;
    }
    bVar2 = std::operator==(psVar7,"string");
    if (bVar2) {
      this->token_ = 0x18;
      return;
    }
    bVar2 = std::operator==(psVar7,"");
    if (bVar2) {
      this->token_ = 0x19;
      return;
    }
    bVar2 = std::operator==(psVar7,"");
    if (bVar2) {
      this->token_ = 0x1a;
      return;
    }
LAB_0010fb03:
    psVar7 = &this->attribute_;
    bVar2 = std::operator==(psVar7,"");
    if (bVar2) {
      this->token_ = 0x1b;
      return;
    }
    bVar2 = std::operator==(psVar7,"true");
    if ((bVar2) || (bVar2 = std::operator==(psVar7,"false"), bVar2)) {
      bVar2 = std::operator==(psVar7,"true");
      NumToString<bool>(&ch,bVar2);
      std::__cxx11::string::operator=((string *)psVar7,(string *)&ch);
      std::__cxx11::string::~string((string *)&ch);
      this->token_ = 2;
      return;
    }
LAB_0010fbac:
    __lhs = &this->attribute_;
    bVar2 = std::operator==(__lhs,"table");
    if (bVar2) {
      this->token_ = 5;
      return;
    }
    bVar2 = std::operator==(__lhs,"struct");
    if (bVar2) {
      this->token_ = 6;
      return;
    }
  }
  bVar2 = std::operator==(__lhs,"enum");
  if (bVar2) {
    this->token_ = 7;
    return;
  }
  bVar2 = std::operator==(__lhs,"union");
  if (bVar2) {
    this->token_ = 8;
    return;
  }
  bVar2 = std::operator==(__lhs,"namespace");
  if (bVar2) {
    this->token_ = 9;
    return;
  }
  bVar2 = std::operator==(__lhs,"root_type");
  if (bVar2) {
    this->token_ = 10;
    return;
  }
  this->token_ = 4;
  return;
}

Assistant:

void Parser::Next() {
  doc_comment_.clear();
  bool seen_newline = false;
  for (;;) {
    char c = *cursor_++;
    token_ = c;
    switch (c) {
      case '\0': cursor_--; token_ = kTokenEof; return;
      case ' ': case '\r': case '\t': break;
      case '\n': line_++; seen_newline = true; break;
      case '{': case '}': case '(': case ')': case '[': case ']': return;
      case ',': case ':': case ';': case '=': return;
      case '.':
        if(!isdigit(*cursor_)) return;
        Error("floating point constant can\'t start with \".\"");
        break;
      case '\"':
        attribute_ = "";
        while (*cursor_ != '\"') {
          if (*cursor_ < ' ' && *cursor_ >= 0)
            Error("illegal character in string constant");
          if (*cursor_ == '\\') {
            cursor_++;
            switch (*cursor_) {
              case 'n':  attribute_ += '\n'; cursor_++; break;
              case 't':  attribute_ += '\t'; cursor_++; break;
              case 'r':  attribute_ += '\r'; cursor_++; break;
              case '\"': attribute_ += '\"'; cursor_++; break;
              case '\\': attribute_ += '\\'; cursor_++; break;
              default: Error("unknown escape code in string constant"); break;
            }
          } else { // printable chars + UTF-8 bytes
            attribute_ += *cursor_++;
          }
        }
        cursor_++;
        token_ = kTokenStringConstant;
        return;
      case '/':
        if (*cursor_ == '/') {
          const char *start = ++cursor_;
          while (*cursor_ && *cursor_ != '\n') cursor_++;
          if (*start == '/') {  // documentation comment
            if (!seen_newline)
              Error("a documentation comment should be on a line on its own");
            // todo: do we want to support multiline comments instead?
            doc_comment_ += std::string(start + 1, cursor_);
          }
          break;
        }
        // fall thru
      default:
        if (isalpha(static_cast<unsigned char>(c))) {
          // Collect all chars of an identifier:
          const char *start = cursor_ - 1;
          while (isalnum(static_cast<unsigned char>(*cursor_)) ||
                 *cursor_ == '_')
            cursor_++;
          attribute_.clear();
          attribute_.append(start, cursor_);
          // First, see if it is a type keyword from the table of types:
          #define FLATBUFFERS_TD(ENUM, IDLTYPE, CTYPE, JTYPE) \
            if (attribute_ == IDLTYPE) { \
              token_ = kToken ## ENUM; \
              return; \
            }
            FLATBUFFERS_GEN_TYPES(FLATBUFFERS_TD)
          #undef FLATBUFFERS_TD
          // If it's a boolean constant keyword, turn those into integers,
          // which simplifies our logic downstream.
          if (attribute_ == "true" || attribute_ == "false") {
            attribute_ = NumToString(attribute_ == "true");
            token_ = kTokenIntegerConstant;
            return;
          }
          // Check for declaration keywords:
          if (attribute_ == "table")     { token_ = kTokenTable;     return; }
          if (attribute_ == "struct")    { token_ = kTokenStruct;    return; }
          if (attribute_ == "enum")      { token_ = kTokenEnum;      return; }
          if (attribute_ == "union")     { token_ = kTokenUnion;     return; }
          if (attribute_ == "namespace") { token_ = kTokenNameSpace; return; }
          if (attribute_ == "root_type") { token_ = kTokenRootType;  return; }
          // If not, it is a user-defined identifier:
          token_ = kTokenIdentifier;
          return;
        } else if (isdigit(static_cast<unsigned char>(c)) || c == '-') {
          const char *start = cursor_ - 1;
          while (isdigit(static_cast<unsigned char>(*cursor_))) cursor_++;
          if (*cursor_ == '.') {
            cursor_++;
            while (isdigit(static_cast<unsigned char>(*cursor_))) cursor_++;
            token_ = kTokenFloatConstant;
          } else {
            token_ = kTokenIntegerConstant;
          }
          attribute_.clear();
          attribute_.append(start, cursor_);
          return;
        }
        std::string ch;
        ch = c;
        if (c < ' ' || c > '~') ch = "code: " + NumToString(c);
        Error("illegal character: " + ch);
        break;
    }
  }
}